

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

int __thiscall branch_and_reduce_algorithm::get_max_deg_vtx(branch_and_reduce_algorithm *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference piVar6;
  iterator iStack_88;
  int w2;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  iterator iStack_68;
  int w_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  iterator iStack_48;
  int w;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  longlong e;
  int degree;
  int u;
  longlong minE;
  int dv;
  int v;
  branch_and_reduce_algorithm *this_local;
  
  minE._0_4_ = -1;
  _degree = (value_type *)0x0;
  for (e._4_4_ = 0; e._4_4_ < this->n; e._4_4_ = e._4_4_ + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)e._4_4_);
    if ((*pvVar4 < 0) && (iVar3 = deg(this,e._4_4_), (int)minE <= iVar3)) {
      __range3 = (value_type *)0x0;
      fast_set::clear(&this->used);
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)e._4_4_);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
      iStack_48 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffb8), bVar2) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        iVar1 = *piVar6;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
        if (*pvVar4 < 0) {
          fast_set::add(&this->used,iVar1);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)e._4_4_);
      __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
      iStack_68 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
      while (bVar2 = __gnu_cxx::operator!=(&__end3_1,&stack0xffffffffffffff98), bVar2) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3_1);
        iVar1 = *piVar6;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
        if (*pvVar4 < 0) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->adj,(long)iVar1);
          __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
          iStack_88 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
          while (bVar2 = __gnu_cxx::operator!=(&__end5,&stack0xffffffffffffff78), bVar2) {
            piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end5);
            iVar1 = *piVar6;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
            if ((*pvVar4 < 0) && (bVar2 = fast_set::get(&this->used,iVar1), bVar2)) {
              __range3 = (value_type *)
                         ((long)&(__range3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + 1);
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end5);
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3_1);
      }
      if (((int)minE < iVar3) || (((int)minE == iVar3 && ((long)__range3 < (long)_degree)))) {
        _degree = __range3;
        minE._4_4_ = e._4_4_;
        minE._0_4_ = iVar3;
      }
    }
  }
  return minE._4_4_;
}

Assistant:

int inline branch_and_reduce_algorithm::get_max_deg_vtx()
{
    int v, dv = -1;
    long long minE = 0;
    for (int u = 0; u < n; u++)
        if (x[u] < 0)
        {
            int degree = deg(u);
            if (dv > degree)
                continue;
            long long e = 0;
            used.clear();
            for (int w : adj[u])
                if (x[w] < 0)
                    used.add(w);
            for (int w : adj[u])
                if (x[w] < 0)
                {
                    for (int w2 : adj[w])
                        if (x[w2] < 0 && used.get(w2))
                            e++;
                }
            if (dv < degree || (dv == degree && minE > e))
            {
                dv = degree;
                minE = e;
                v = u;
            }
        }

    return v;
}